

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::generate_struct_definition
          (t_cpp_generator *this,ostream *out,ostream *force_cpp_out,t_struct *tstruct,bool setters,
          bool is_user_struct)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined3 in_register_00000089;
  pointer pptVar6;
  key_type local_80;
  ostream *local_60;
  string local_58;
  undefined4 local_34;
  
  local_34 = CONCAT31(in_register_00000089,is_user_struct);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_60 = out;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"final","");
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(tstruct->super_t_type).annotations_._M_t,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(tstruct->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (force_cpp_out,::endl_abi_cxx11_._M_dataplus._M_p,
                        ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,local_80._M_dataplus._M_p,local_80._M_string_length);
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var,iVar3),
                        ((undefined8 *)CONCAT44(extraout_var,iVar3))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::~",3);
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,*(char **)CONCAT44(extraout_var_00,iVar3),
                        ((undefined8 *)CONCAT44(extraout_var_00,iVar3))[1]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"() noexcept {",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (force_cpp_out,local_80._M_dataplus._M_p,local_80._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if ((setters) &&
     (pptVar6 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
     pptVar6 !=
     (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    do {
      bVar2 = (*pptVar6)->reference_;
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_60,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      if (bVar2 == true) {
        t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_80._M_dataplus._M_p,local_80._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void ",5);
        iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,*(char **)CONCAT44(extraout_var_01,iVar3),
                            ((undefined8 *)CONCAT44(extraout_var_01,iVar3))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::__set_",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar6)->name_)._M_dataplus._M_p,
                            ((*pptVar6)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(::std::shared_ptr<",0x13);
        type_name_abi_cxx11_(&local_58,this,(*pptVar6)->type_,false,false);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,">",1);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_80._M_dataplus._M_p,local_80._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"void ",5);
        iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,*(char **)CONCAT44(extraout_var_02,iVar3),
                            ((undefined8 *)CONCAT44(extraout_var_02,iVar3))[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"::__set_",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar6)->name_)._M_dataplus._M_p,
                            ((*pptVar6)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
        type_name_abi_cxx11_(&local_58,this,(*pptVar6)->type_,false,true);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      poVar5 = local_60;
      std::__ostream_insert<char,std::char_traits<char>>(local_60," val) {",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"this->",6);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,((*pptVar6)->name_)._M_dataplus._M_p,
                          ((*pptVar6)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," = val;",7);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      if ((*pptVar6)->req_ == T_OPTIONAL) {
        t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_60,local_80._M_dataplus._M_p,local_80._M_string_length);
        t_generator::indent_abi_cxx11_(&local_58,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_58._M_dataplus._M_p,local_58._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__isset.",8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar6)->name_)._M_dataplus._M_p,
                            ((*pptVar6)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = true;",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      t_generator::indent_abi_cxx11_(&local_80,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_60,local_80._M_dataplus._M_p,local_80._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if ((char)local_34 != '\0') {
    generate_struct_ostream_operator(this,local_60,tstruct);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (local_60,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_definition(ostream& out,
                                                 ostream& force_cpp_out,
                                                 t_struct* tstruct,
                                                 bool setters,
                                                 bool is_user_struct) {
  // Get members
  vector<t_field*>::const_iterator m_iter;
  const vector<t_field*>& members = tstruct->get_members();

  // Destructor
  if (tstruct->annotations_.find("final") == tstruct->annotations_.end()) {
    force_cpp_out << endl << indent() << tstruct->get_name() << "::~" << tstruct->get_name()
                  << "() noexcept {" << endl;
    indent_up();

    indent_down();
    force_cpp_out << indent() << "}" << endl << endl;
  }

  // Create a setter function for each field
  if (setters) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      if (is_reference((*m_iter))) {
        out << endl << indent() << "void " << tstruct->get_name() << "::__set_"
            << (*m_iter)->get_name() << "(::std::shared_ptr<"
            << type_name((*m_iter)->get_type(), false, false) << ">";
        out << " val) {" << endl;
      } else {
        out << endl << indent() << "void " << tstruct->get_name() << "::__set_"
            << (*m_iter)->get_name() << "(" << type_name((*m_iter)->get_type(), false, true);
        out << " val) {" << endl;
      }
      indent_up();
      out << indent() << "this->" << (*m_iter)->get_name() << " = val;" << endl;
      indent_down();

      // assume all fields are required except optional fields.
      // for optional fields change __isset.name to true
      bool is_optional = (*m_iter)->get_req() == t_field::T_OPTIONAL;
      if (is_optional) {
        out << indent() << indent() << "__isset." << (*m_iter)->get_name() << " = true;" << endl;
      }
      out << indent() << "}" << endl;
    }
  }
  if (is_user_struct) {
    generate_struct_ostream_operator(out, tstruct);
  }
  out << endl;
}